

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

u8 read_u8_pair(Emulator *e,MemoryTypeAddressPair pair,Bool raw)

{
  uint rom_addr_00;
  char *pcVar1;
  u8 value_1;
  u8 value;
  u32 rom_addr;
  Bool raw_local;
  Emulator *e_local;
  ushort uStack_10;
  MemoryTypeAddressPair pair_local;
  
  uStack_10 = pair.addr;
  switch((ulong)pair & 0xffffffff) {
  case 0:
  case 1:
    rom_addr_00 = (e->state).memory_map_state.rom_base[(ulong)pair & 0xffffffff] | (uint)uStack_10;
    if (e->cart_info->size <= (ulong)rom_addr_00) {
      __assert_fail("rom_addr < e->cart_info->size",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c"
                    ,0x7a0,"u8 read_u8_pair(Emulator *, MemoryTypeAddressPair, Bool)");
    }
    pair_local.type._3_1_ = e->cart_info->data[rom_addr_00];
    if (raw == FALSE) {
      HOOK_read_rom_ib(e,"read_u8_pair",rom_addr_00,pair_local.type._3_1_);
    }
    break;
  case 2:
    pair_local.type._3_1_ = read_vram(e,uStack_10);
    break;
  case 3:
    pair_local.type._3_1_ = (*(e->memory_map).read_ext_ram)(e,uStack_10);
    break;
  case 4:
    pair_local.type._3_1_ = (e->state).wram.data[uStack_10];
    break;
  case 5:
    pair_local.type._3_1_ =
         (e->state).wram.data[(int)((uint)(e->state).wram.offset + (uint)uStack_10)];
    break;
  case 6:
    pair_local.type._3_1_ = read_oam(e,uStack_10);
    break;
  case 7:
    pair_local.type._3_1_ = 0xff;
    break;
  case 8:
    pair_local.type._3_1_ = read_io(e,uStack_10);
    pcVar1 = get_io_reg_string((uint)uStack_10);
    HOOK_read_io_asb(e,"read_u8_pair",(ulong)uStack_10,pcVar1,(ulong)(byte)pair_local.type._3_1_);
    break;
  case 9:
    pair_local.type._3_1_ = read_apu(e,uStack_10);
    break;
  case 10:
    pair_local.type._3_1_ = read_wave_ram(e,uStack_10);
    break;
  case 0xb:
    pair_local.type._3_1_ = (e->state).hram[uStack_10];
    break;
  default:
    fprintf(_stderr,"invalid address: %u 0x%04x.\n",(ulong)pair & 0xffffffff,(ulong)uStack_10);
    exit(1);
  }
  return pair_local.type._3_1_;
}

Assistant:

static u8 read_u8_pair(Emulator* e, MemoryTypeAddressPair pair, Bool raw) {
  switch (pair.type) {
    /* Take advantage of the fact that MEMORY_MAP_ROM9 is 0, and ROM1 is 1 when
     * indexing into rom_base. */
    case MEMORY_MAP_ROM0:
    case MEMORY_MAP_ROM1: {
      u32 rom_addr = MMAP_STATE.rom_base[pair.type] | pair.addr;
      assert(rom_addr < e->cart_info->size);
      u8 value = e->cart_info->data[rom_addr];
      if (!raw) {
        HOOK(read_rom_ib, rom_addr, value);
      }
      return value;
    }
    case MEMORY_MAP_VRAM:
      return read_vram(e, pair.addr);
    case MEMORY_MAP_EXT_RAM:
      return e->memory_map.read_ext_ram(e, pair.addr);
    case MEMORY_MAP_WORK_RAM0:
      return WRAM.data[pair.addr];
    case MEMORY_MAP_WORK_RAM1:
      return WRAM.data[WRAM.offset + pair.addr];
    case MEMORY_MAP_OAM:
      return read_oam(e, pair.addr);
    case MEMORY_MAP_UNUSED:
      return INVALID_READ_BYTE;
    case MEMORY_MAP_IO: {
      u8 value = read_io(e, pair.addr);
      HOOK(read_io_asb, pair.addr, get_io_reg_string(pair.addr), value);
      return value;
    }
    case MEMORY_MAP_APU:
      return read_apu(e, pair.addr);
    case MEMORY_MAP_WAVE_RAM:
      return read_wave_ram(e, pair.addr);
    case MEMORY_MAP_HIGH_RAM:
      return HRAM[pair.addr];
    default:
      UNREACHABLE("invalid address: %u 0x%04x.\n", pair.type, pair.addr);
  }
}